

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

void Gia_ManCheckResub(Vec_Ptr_t *vDivs,int nWords)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  Vec_Int_t *p;
  ulong uVar4;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint Entry;
  long lVar10;
  int pVarSet [10];
  
  pVarSet[8] = 0;
  pVarSet[9] = 0;
  pVarSet[4] = 0;
  pVarSet[5] = 0;
  pVarSet[6] = 0;
  pVarSet[7] = 0;
  pVarSet[0] = 2;
  pVarSet[1] = 3;
  pVarSet[2] = 4;
  pVarSet[3] = 0;
  pvVar2 = Vec_PtrEntry(vDivs,0);
  pvVar3 = Vec_PtrEntry(vDivs,1);
  p = Vec_IntStartFull(0x40);
  puts("Verifying resub:");
  iVar8 = nWords << 6;
  if (nWords << 6 < 1) {
    iVar8 = 0;
  }
  for (uVar7 = 0; (int)uVar7 != iVar8; uVar7 = (ulong)((int)uVar7 + 1)) {
    uVar4 = (ulong)(uint)((int)(uVar7 >> 6) * 8);
    Entry = (uint)((*(ulong *)((long)pvVar3 + uVar4) >> (uVar7 & 0x3f) & 1) != 0);
    if (((*(ulong *)((long)pvVar2 + uVar4) >> (uVar7 & 0x3f) & 1) != 0) || (Entry != 0)) {
      uVar9 = 0;
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        pvVar5 = Vec_PtrEntry(vDivs,pVarSet[lVar10]);
        uVar6 = 1 << ((byte)lVar10 & 0x1f);
        if ((*(ulong *)((long)pvVar5 + (uVar7 >> 6) * 8) & 1L << ((byte)uVar7 & 0x3f)) == 0) {
          uVar6 = 0;
        }
        uVar9 = uVar9 | uVar6;
      }
      iVar1 = Vec_IntEntry(p,uVar9);
      if (iVar1 == -1) {
        Vec_IntWriteEntry(p,uVar9,Entry);
      }
      else {
        uVar9 = Vec_IntEntry(p,uVar9);
        if (uVar9 != Entry) {
          printf("Mismatch in pattern %d\n",uVar7);
        }
      }
    }
  }
  puts("Finished verifying resub.");
  Vec_IntFree(p);
  return;
}

Assistant:

void Gia_ManCheckResub( Vec_Ptr_t * vDivs, int nWords )
{
    //int i, nVars = 6, pVarSet[10] = { 2, 189, 2127, 2125, 177, 178 };
    int i, nVars = 3, pVarSet[10] = { 2, 3, 4 };
    word * pOff = (word *)Vec_PtrEntry( vDivs, 0 );
    word * pOn  = (word *)Vec_PtrEntry( vDivs, 1 );
    Vec_Int_t * vValue = Vec_IntStartFull( 1 << 6 );
    printf( "Verifying resub:\n" );
    for ( i = 0; i < 64*nWords; i++ )
    {
        int v, Mint = 0, Value = Abc_TtGetBit(pOn, i);
        if ( !Abc_TtGetBit(pOff, i) && !Value )
            continue;
        for ( v = 0; v < nVars; v++ )
            if ( Abc_TtGetBit((word *)Vec_PtrEntry(vDivs, pVarSet[v]), i) )
                Mint |= 1 << v;
        if ( Vec_IntEntry(vValue, Mint) == -1 )
            Vec_IntWriteEntry(vValue, Mint, Value);
        else if ( Vec_IntEntry(vValue, Mint) != Value )
            printf( "Mismatch in pattern %d\n", i );
    }
    printf( "Finished verifying resub.\n" );
    Vec_IntFree( vValue );
}